

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int64_t mtree_atol(char **p)

{
  char cVar1;
  long lVar2;
  int64_t iVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char cVar9;
  long lVar10;
  
  pcVar8 = *p;
  if (*pcVar8 != '0') {
    pcVar8 = *p;
    cVar1 = *pcVar8;
    uVar5 = 7;
    cVar9 = cVar1;
    if (cVar1 == '-') {
      *p = pcVar8 + 1;
      pcVar4 = pcVar8 + 1;
      uVar5 = 8;
      pcVar8 = pcVar8 + 1;
      cVar9 = *pcVar4;
    }
    uVar7 = (int)cVar9 - 0x30;
    if (uVar7 < 10) {
      lVar2 = 0;
      do {
        pcVar8 = pcVar8 + 1;
        if ((0xccccccccccccccc < lVar2) || (uVar5 < uVar7 && lVar2 == 0xccccccccccccccc)) {
          iVar3 = -0x8000000000000000;
          if (cVar1 != '-') {
            iVar3 = 0x7fffffffffffffff;
          }
          return iVar3;
        }
        lVar2 = (ulong)uVar7 + lVar2 * 10;
        *p = pcVar8;
        uVar7 = (int)*pcVar8 - 0x30;
      } while (uVar7 < 10);
    }
    else {
      lVar2 = 0;
    }
    lVar10 = -lVar2;
    if (cVar1 != '-') {
      lVar10 = lVar2;
    }
    return lVar10;
  }
  if ((byte)(pcVar8[1] | 0x20U) != 0x78) {
    uVar7 = 0;
    lVar2 = 0;
    do {
      pcVar8 = pcVar8 + 1;
      if (0xfffffffffffffff < lVar2) {
        return 0x7fffffffffffffff;
      }
      lVar2 = (ulong)uVar7 + lVar2 * 8;
      *p = pcVar8;
      uVar7 = (int)*pcVar8 - 0x30;
    } while (uVar7 < 8);
    return lVar2;
  }
  lVar2 = 0x7ffffffffffffff;
  pcVar4 = pcVar8 + 2;
  *p = pcVar4;
  cVar1 = pcVar8[2];
  uVar5 = 0xf;
  cVar9 = cVar1;
  if (cVar1 == '-') {
    pcVar4 = pcVar8 + 3;
    *p = pcVar4;
    lVar2 = 0x800000000000000;
    uVar5 = 0;
    cVar9 = pcVar8[3];
  }
  iVar6 = (int)cVar9;
  if ((byte)(cVar9 - 0x30U) < 10) {
    uVar7 = iVar6 - 0x30;
LAB_00179170:
    if (-1 < (int)uVar7) {
      lVar10 = 0;
      do {
        pcVar4 = pcVar4 + 1;
        if ((lVar10 != lVar2 && lVar2 <= lVar10) || (uVar5 < uVar7 && lVar10 == lVar2)) {
          iVar3 = -0x8000000000000000;
          if (cVar1 != '-') {
            iVar3 = 0x7fffffffffffffff;
          }
          return iVar3;
        }
        lVar10 = lVar10 * 0x10 + (ulong)uVar7;
        *p = pcVar4;
        cVar9 = *pcVar4;
        iVar6 = (int)cVar9;
        if ((byte)(cVar9 - 0x30U) < 10) {
          uVar7 = iVar6 - 0x30;
        }
        else if ((byte)(cVar9 + 0x9fU) < 6) {
          uVar7 = iVar6 - 0x61;
        }
        else {
          if (5 < (byte)(cVar9 + 0xbfU)) break;
          uVar7 = iVar6 - 0x41;
        }
      } while (-1 < (int)uVar7);
      goto LAB_001791e0;
    }
  }
  else {
    if ((byte)(cVar9 + 0x9fU) < 6) {
      uVar7 = iVar6 - 0x61;
      goto LAB_00179170;
    }
    if ((byte)(cVar9 + 0xbfU) < 6) {
      uVar7 = iVar6 - 0x41;
      goto LAB_00179170;
    }
  }
  lVar10 = 0;
LAB_001791e0:
  lVar2 = -lVar10;
  if (cVar1 != '-') {
    lVar2 = lVar10;
  }
  return lVar2;
}

Assistant:

static int64_t
mtree_atol(char **p)
{
	if (**p != '0')
		return mtree_atol10(p);
	if ((*p)[1] == 'x' || (*p)[1] == 'X') {
		*p += 2;
		return mtree_atol16(p);
	}
	return mtree_atol8(p);
}